

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::Shape::update
          (Shape *this,int frameNo,VMatrix *param_2,float param_3,DirtyFlag *flag)

{
  bool bVar1;
  model *in_RAX;
  vcow_ptr<VPath::VPathData> local_28;
  
  this->mDirtyPath = false;
  local_28.mModel = in_RAX;
  bVar1 = hasChanged(this,frameNo);
  if (bVar1) {
    local_28.mModel = (model *)0x0;
    vcow_ptr<VPath::VPathData>::vcow_ptr(&local_28);
    vcow_ptr<VPath::VPathData>::operator=(&(this->mTemp).d,&local_28);
    vcow_ptr<VPath::VPathData>::~vcow_ptr(&local_28);
    (*(this->super_Object)._vptr_Object[6])(this,&this->mLocalPath,frameNo);
    this->mDirtyPath = true;
  }
  vcow_ptr<VPath::VPathData>::operator=(&(this->mTemp).d,&(this->mLocalPath).d);
  if ((flag->i & 1) != 0) {
    this->mDirtyPath = true;
  }
  return;
}

Assistant:

void renderer::Shape::update(int              frameNo, const VMatrix &, float,
                             const DirtyFlag &flag)
{
    mDirtyPath = false;

    // 1. update the local path if needed
    if (hasChanged(frameNo)) {
        // loose the reference to mLocalPath if any
        // from the last frame update.
        mTemp = VPath();

        updatePath(mLocalPath, frameNo);
        mDirtyPath = true;
    }
    // 2. keep a reference path in temp in case there is some
    // path operation like trim which will update the path.
    // we don't want to update the local path.
    mTemp = mLocalPath;

    // 3. mark the path dirty if matrix has changed.
    if (flag & DirtyFlagBit::Matrix) {
        mDirtyPath = true;
    }
}